

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::NestedDescriptorTest_FindEnumTypeByName_Test::
NestedDescriptorTest_FindEnumTypeByName_Test(NestedDescriptorTest_FindEnumTypeByName_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_NestedDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NestedDescriptorTest_01883358;
  DescriptorPool::DescriptorPool(&(this->super_NestedDescriptorTest).pool_);
  (this->super_NestedDescriptorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NestedDescriptorTest_018784f0;
  return;
}

Assistant:

TEST_F(NestedDescriptorTest, FindEnumTypeByName) {
  EXPECT_EQ(baz_, message_->FindEnumTypeByName("Baz"));
  EXPECT_EQ(moo_, message_->FindEnumTypeByName("Moo"));
  EXPECT_EQ(moo2_, message2_->FindEnumTypeByName("Moo"));
  EXPECT_EQ(mooo2_, message2_->FindEnumTypeByName("Mooo"));

  EXPECT_TRUE(message_->FindEnumTypeByName("NoSuchType") == nullptr);
  EXPECT_TRUE(message_->FindEnumTypeByName("Mooo") == nullptr);
  EXPECT_TRUE(message2_->FindEnumTypeByName("Baz") == nullptr);

  EXPECT_TRUE(message_->FindEnumTypeByName("Foo") == nullptr);
}